

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cpp
# Opt level: O0

void __thiscall unit_test::~unit_test(unit_test *this)

{
  unit_test *in_RDI;
  
  ~unit_test(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

~unit_test()
	{
		c_->dec();
	}